

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

string_view __thiscall cinatra::http_parser::get_boundary(http_parser *this)

{
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view key;
  string_view content_type;
  
  key._M_str = "Content-Type";
  key._M_len = 0xc;
  content_type = get_header_value(this,key);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&content_type,"=--",0);
  if (sVar1 == 0xffffffffffffffff) {
    bVar2 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x127c82) << 0x40);
  }
  else {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&content_type,sVar1 + 1,0xffffffffffffffff);
  }
  sVar3._M_len = bVar2._M_len;
  sVar3._M_str = bVar2._M_str;
  return sVar3;
}

Assistant:

std::string_view get_boundary() {
    auto content_type = get_header_value("Content-Type");
    size_t pos = content_type.find("=--");
    if (pos == std::string_view::npos) {
      return "";
    }

    return content_type.substr(pos + 1);
  }